

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::TracingServiceImpl::EmitSyncMarker
          (TracingServiceImpl *this,
          vector<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_> *packets)

{
  RootMessage<perfetto::protos::pbzero::TracePacket> *this_00;
  size_t sVar1;
  StaticBuffered<perfetto::protos::pbzero::TracePacket> packet;
  
  if (this->sync_marker_packet_size_ == 0) {
    protozero::StaticBuffered<perfetto::protos::pbzero::TracePacket>::StaticBuffered
              (&packet,this->sync_marker_packet_,0x20);
    this_00 = &packet.msg_;
    protos::pbzero::TracePacket::set_trusted_uid(&this_00->super_TracePacket,this->uid_);
    protos::pbzero::TracePacket::set_trusted_packet_sequence_id(&this_00->super_TracePacket,1);
    protos::pbzero::TracePacket::set_synchronization_marker
              (&this_00->super_TracePacket,kSyncMarker,0x10);
    sVar1 = protozero::StaticBuffered<perfetto::protos::pbzero::TracePacket>::Finalize(&packet);
    this->sync_marker_packet_size_ = sVar1;
    protozero::MessageArena::~MessageArena(&packet.msg_.root_arena_);
    protozero::ScatteredStreamWriter::~ScatteredStreamWriter(&packet.writer_);
    protozero::StaticBufferDelegate::~StaticBufferDelegate(&packet.delegate_);
  }
  std::vector<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_>::emplace_back<>
            (packets);
  TracePacket::AddSlice
            ((packets->
             super__Vector_base<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_>).
             _M_impl.super__Vector_impl_data._M_finish + -1,this->sync_marker_packet_,
             this->sync_marker_packet_size_);
  return;
}

Assistant:

void TracingServiceImpl::EmitSyncMarker(std::vector<TracePacket>* packets) {
  // The sync marks are used to tokenize large traces efficiently.
  // See description in trace_packet.proto.
  if (sync_marker_packet_size_ == 0) {
    // The marker ABI expects that the marker is written after the uid.
    // Protozero guarantees that fields are written in the same order of the
    // calls. The ResynchronizeTraceStreamUsingSyncMarker test verifies the ABI.
    protozero::StaticBuffered<protos::pbzero::TracePacket> packet(
        &sync_marker_packet_[0], sizeof(sync_marker_packet_));
    packet->set_trusted_uid(static_cast<int32_t>(uid_));
    packet->set_trusted_packet_sequence_id(kServicePacketSequenceID);

    // Keep this last.
    packet->set_synchronization_marker(kSyncMarker, sizeof(kSyncMarker));
    sync_marker_packet_size_ = packet.Finalize();
  }
  packets->emplace_back();
  packets->back().AddSlice(&sync_marker_packet_[0], sync_marker_packet_size_);
}